

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiListClipper::Begin(ImGuiListClipper *this,int items_count,float items_height)

{
  int *piVar1;
  undefined4 *puVar2;
  undefined8 *puVar3;
  int iVar4;
  int iVar5;
  ImGuiWindow *pIVar6;
  ImGuiTable *table;
  ImGuiListClipperData *pIVar7;
  ImGuiContext *pIVar8;
  ImGuiListClipperData *pIVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  
  pIVar8 = GImGui;
  pIVar6 = GImGui->CurrentWindow;
  if ((GImGui->DebugLogFlags & 0x10) != 0) {
    ImGui::DebugLog("Clipper: Begin(%d,%.2f) in \'%s\'\n",SUB84((double)items_height,0),items_count,
                    pIVar6->Name);
  }
  table = pIVar8->CurrentTable;
  if ((table != (ImGuiTable *)0x0) && (table->IsInsideRow == true)) {
    ImGui::TableEndRow(table);
  }
  this->StartPosY = (pIVar6->DC).CursorPos.y;
  this->ItemsHeight = items_height;
  this->ItemsCount = items_count;
  this->DisplayStart = -1;
  this->DisplayEnd = 0;
  iVar11 = pIVar8->ClipperTempDataStacked;
  iVar5 = iVar11 + 1;
  pIVar8->ClipperTempDataStacked = iVar5;
  if ((pIVar8->ClipperTempData).Size <= iVar11) {
    iVar4 = (pIVar8->ClipperTempData).Capacity;
    if (iVar4 <= iVar11) {
      if (iVar4 == 0) {
        iVar12 = 8;
      }
      else {
        iVar12 = iVar4 / 2 + iVar4;
      }
      if (iVar12 <= iVar5) {
        iVar12 = iVar5;
      }
      if (iVar4 < iVar12) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pIVar9 = (ImGuiListClipperData *)
                 (*GImAllocatorAllocFunc)((long)iVar12 * 0x28,GImAllocatorUserData);
        pIVar7 = (pIVar8->ClipperTempData).Data;
        if (pIVar7 != (ImGuiListClipperData *)0x0) {
          memcpy(pIVar9,pIVar7,(long)(pIVar8->ClipperTempData).Size * 0x28);
          pIVar7 = (pIVar8->ClipperTempData).Data;
          if ((pIVar7 != (ImGuiListClipperData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar7,GImAllocatorUserData);
        }
        (pIVar8->ClipperTempData).Data = pIVar9;
        (pIVar8->ClipperTempData).Capacity = iVar12;
      }
    }
    iVar4 = (pIVar8->ClipperTempData).Size;
    if (iVar4 <= iVar11) {
      iVar11 = (iVar11 - iVar4) + 1;
      lVar10 = (long)iVar4 * 0x28;
      do {
        pIVar7 = (pIVar8->ClipperTempData).Data;
        *(undefined8 *)((long)&(pIVar7->Ranges).Data + lVar10) = 0;
        puVar3 = (undefined8 *)((long)&pIVar7->ItemsFrozen + lVar10);
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar2 = (undefined4 *)((long)&pIVar7->ListClipper + lVar10);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2[2] = 0;
        puVar2[3] = 0;
        lVar10 = lVar10 + 0x28;
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
    }
    (pIVar8->ClipperTempData).Size = iVar5;
  }
  iVar5 = pIVar8->ClipperTempDataStacked;
  pIVar7 = (pIVar8->ClipperTempData).Data;
  pIVar9 = pIVar7 + (long)iVar5 + -1;
  ImGuiListClipperData::Reset(pIVar9,this);
  pIVar7[(long)iVar5 + -1].LossynessOffset = (pIVar6->DC).CursorStartPosLossyness.y;
  this->TempData = pIVar9;
  return;
}

Assistant:

void ImGuiListClipper::Begin(int items_count, float items_height)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IMGUI_DEBUG_LOG_CLIPPER("Clipper: Begin(%d,%.2f) in '%s'\n", items_count, items_height, window->Name);

    if (ImGuiTable* table = g.CurrentTable)
        if (table->IsInsideRow)
            ImGui::TableEndRow(table);

    StartPosY = window->DC.CursorPos.y;
    ItemsHeight = items_height;
    ItemsCount = items_count;
    DisplayStart = -1;
    DisplayEnd = 0;

    // Acquire temporary buffer
    if (++g.ClipperTempDataStacked > g.ClipperTempData.Size)
        g.ClipperTempData.resize(g.ClipperTempDataStacked, ImGuiListClipperData());
    ImGuiListClipperData* data = &g.ClipperTempData[g.ClipperTempDataStacked - 1];
    data->Reset(this);
    data->LossynessOffset = window->DC.CursorStartPosLossyness.y;
    TempData = data;
}